

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void send_field_slice(int left,int width,int destination_rank)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)left;
  iVar1 = width * ny_global * nz_global * 3;
  MPI_Send(**(undefined8 **)
             (*(long *)((long)psr._M_t.
                              super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                              .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x178)
             + lVar2 * 8),iVar1,&ompi_mpi_double,destination_rank,0,&ompi_mpi_comm_world);
  MPI_Send(**(undefined8 **)
             (*(long *)((long)psr._M_t.
                              super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                              .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x1a0)
             + lVar2 * 8),iVar1,&ompi_mpi_double,destination_rank,1,&ompi_mpi_comm_world);
  MPI_Send(**(undefined8 **)
             (*(long *)((long)psr._M_t.
                              super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                              .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x1c8)
             + lVar2 * 8),iVar1,&ompi_mpi_double,destination_rank,2,&ompi_mpi_comm_world);
  MPI_Send(**(undefined8 **)
             (*(long *)((long)psr._M_t.
                              super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                              .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x1f0)
             + lVar2 * 8),iVar1,&ompi_mpi_double,destination_rank,3,&ompi_mpi_comm_world);
  return;
}

Assistant:

void send_field_slice(int left, int width, int destination_rank) {
    int tag = 0;

    const int size = 3 * width * ny_global * nz_global;
    MPI_Send(psr->ce[left][0], size, MPI_DOUBLE, destination_rank, tag++, MPI_COMM_WORLD);
    MPI_Send(psr->cb[left][0], size, MPI_DOUBLE, destination_rank, tag++, MPI_COMM_WORLD);
    MPI_Send(psr->cj[left][0], size, MPI_DOUBLE, destination_rank, tag++, MPI_COMM_WORLD);
    MPI_Send(psr->cbe[left][0], size, MPI_DOUBLE, destination_rank, tag++, MPI_COMM_WORLD);
}